

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int cd_detection_rule_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  coda_detection_rule *pcVar3;
  
  info->node->free_data = coda_detection_rule_delete;
  pcVar3 = coda_detection_rule_new();
  pnVar1 = info->node;
  pnVar1->data = pcVar3;
  if (pcVar3 == (coda_detection_rule *)0x0) {
    iVar2 = -1;
  }
  else {
    pnVar1->init_sub_element[0x17] = cd_match_data_init;
    pnVar1->add_element_to_parent[0x17] = cd_detection_rule_add_entry;
    pnVar1 = info->node;
    pnVar1->init_sub_element[0x18] = cd_match_expression_init;
    pnVar1->add_element_to_parent[0x18] = cd_detection_rule_add_entry;
    pnVar1 = info->node;
    pnVar1->init_sub_element[0x19] = cd_match_filename_init;
    pnVar1->add_element_to_parent[0x19] = cd_detection_rule_add_entry;
    pnVar1 = info->node;
    pnVar1->init_sub_element[0x1a] = cd_match_size_init;
    pnVar1->add_element_to_parent[0x1a] = cd_detection_rule_add_entry;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int cd_detection_rule_init(parser_info *info, const char **attr)
{
    (void)attr;

    info->node->free_data = (free_data_handler)coda_detection_rule_delete;
    info->node->data = coda_detection_rule_new();
    if (info->node->data == NULL)
    {
        return -1;
    }
    register_sub_element(info->node, element_cd_match_data, cd_match_data_init, cd_detection_rule_add_entry);
    register_sub_element(info->node, element_cd_match_expression, cd_match_expression_init,
                         cd_detection_rule_add_entry);
    register_sub_element(info->node, element_cd_match_filename, cd_match_filename_init, cd_detection_rule_add_entry);
    register_sub_element(info->node, element_cd_match_size, cd_match_size_init, cd_detection_rule_add_entry);

    return 0;
}